

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_pow_scalar.c
# Opt level: O3

rt_function_error_t allocate_r_pow_scalar_local_context(rt_function_t *f)

{
  rt_function_error_t rVar1;
  int iVar2;
  int iVar3;
  code *pcVar4;
  rt_list_t shape;
  rt_list_t shape_00;
  
  rVar1 = RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  if ((f->num_of_inputs == 1) &&
     (rVar1 = RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS, f->num_of_outputs == 1)) {
    shape._4_4_ = 0;
    shape.size = ((*f->inputs)->shape).size;
    shape.data = ((*f->inputs)->shape).data;
    iVar2 = calc_shape_size(shape);
    shape_00._4_4_ = 0;
    shape_00.size = ((*f->outputs)->shape).size;
    shape_00.data = ((*f->outputs)->shape).data;
    iVar3 = calc_shape_size(shape_00);
    rVar1 = RT_FUNCTION_ERROR_INVALID_SHAPE;
    if (iVar2 == iVar3) {
      if ((((*f->inputs)->field_0x10 & 0xf) == 0) && (((*f->outputs)->field_0x10 & 0xf) == 0)) {
        pcVar4 = exec_r_pow_scalar;
      }
      else {
        pcVar4 = exec_r_pow_scalar_generic;
      }
      f->exec_func = pcVar4;
      rVar1 = RT_FUNCTION_ERROR_NOERROR;
    }
  }
  return rVar1;
}

Assistant:

rt_function_error_t allocate_r_pow_scalar_local_context(rt_function_t *f) {
  if (f->num_of_inputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }
  if (f->num_of_outputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
  }
  int input_size = calc_shape_size(f->inputs[0]->shape);
  int output_size = calc_shape_size(f->outputs[0]->shape);
  if (input_size != output_size) {
    return RT_FUNCTION_ERROR_INVALID_SHAPE;
  }
  if (f->inputs[0]->type == NN_DATA_TYPE_FLOAT &&
      f->outputs[0]->type == NN_DATA_TYPE_FLOAT) {
#ifdef CONFIG_RPOWSCALAR_FLOAT32
    f->exec_func = exec_r_pow_scalar;
#endif /* CONFIG_RPOWSCALAR_FLOAT32 */
  } else {
#ifdef CONFIG_RPOWSCALAR_GENERIC
    f->exec_func = exec_r_pow_scalar_generic;
#endif /* CONFIG_RPOWSCALAR_GENERIC */
  }
  return RT_FUNCTION_ERROR_NOERROR;
}